

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::ImageTransition::submit(ImageTransition *this,SubmitContext *context)

{
  DeviceInterface *pDVar1;
  undefined4 local_58 [2];
  undefined8 local_50;
  VkAccessFlags local_48;
  undefined8 local_44;
  VkImageLayout local_3c;
  undefined8 local_38;
  deUint64 local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  
  pDVar1 = context->m_context->m_context->m_vkd;
  local_58[0] = 0x2d;
  local_50 = 0;
  local_48 = this->m_srcAccesses;
  local_44._0_4_ = this->m_dstAccesses;
  local_44._4_4_ = this->m_srcLayout;
  local_3c = this->m_dstLayout;
  local_38 = 0xffffffffffffffff;
  local_30 = (context->m_context->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
             m_data.object.m_internal;
  local_28 = 1;
  uStack_24 = 0;
  uStack_20 = 1;
  uStack_1c = 0;
  local_18 = 1;
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,context->m_commandBuffer,(ulong)this->m_srcStages,(ulong)this->m_dstStages,0,0,0
             ,0,0,1,local_58);
  return;
}

Assistant:

void ImageTransition::submit (SubmitContext& context)
{
	const vk::DeviceInterface&		vkd			= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer		cmd			= context.getCommandBuffer();
	const vk::VkImageMemoryBarrier	barrier		=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,

		m_srcAccesses,
		m_dstAccesses,

		m_srcLayout,
		m_dstLayout,

		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,

		context.getImage(),
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0u, 1u,
			0u, 1u
		}
	};

	vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &barrier);
}